

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O2

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  pointer plVar1;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  pointer plVar4;
  _Rb_tree_node_base *p_Var5;
  int64_t comp_sum;
  AssertionHandler local_e0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  int64_t *local_88;
  char *local_80;
  undefined8 local_78;
  undefined1 *local_70;
  vector<long,_std::allocator<long>_> buffer;
  int64_t recvd_sum;
  
  p_Var3 = (_Rb_tree_node_base *)(sig + 0x20);
  p_Var5 = *(_Rb_tree_node_base **)(sig + 0x30);
  while (p_Var5 != (_Rb_tree_node_base *)(sig + 0x20)) {
    buffer.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    buffer.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    buffer.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    diy::Master::Proxy::dequeue<std::vector<long,std::allocator<long>>>
              ((Proxy *)sig,p_Var5[1]._M_color,
               (vector<long,_std::allocator<long>_> *)
               &buffer.super__Vector_base<long,_std::allocator<long>_>,
               diy::load<std::vector<long,std::allocator<long>>>);
    local_e0.m_assertionInfo.macroName.m_start =
         (char *)CONCAT44(local_e0.m_assertionInfo.macroName.m_start._4_4_,p_Var5[1]._M_color);
    pmVar2 = Catch::clara::std::
             map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
             ::operator[]((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                           *)(sig + 0x18),(key_type *)&local_e0);
    (*(pmVar2->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar2,&recvd_sum,8);
    plVar1 = buffer.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    comp_sum = 0;
    for (plVar4 = buffer.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (plVar4 != buffer.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish && (*plVar4 + 9U < 0x13)); plVar4 = plVar4 + 1)
    {
      comp_sum = comp_sum + *plVar4;
    }
    local_e0.m_assertionInfo.macroName.m_start = "CHECK";
    local_e0.m_assertionInfo.macroName.m_size = 5;
    local_e0.m_assertionInfo.lineInfo.file =
         "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/simple.cpp";
    local_e0.m_assertionInfo.lineInfo.line = 0x4a;
    local_e0.m_assertionInfo.capturedExpression.m_start = "valid_values == true";
    local_e0.m_assertionInfo.capturedExpression.m_size = 0x14;
    local_e0.m_assertionInfo.resultDisposition = ContinueOnFailure;
    local_e0.m_reaction.shouldDebugBreak = false;
    local_e0.m_reaction.shouldThrow = false;
    local_e0.m_completed = false;
    local_e0.m_resultCapture = Catch::getResultCapture();
    local_8f = plVar4 == plVar1;
    local_90 = 1;
    local_98 = &PTR_streamReconstructedExpression_001b9868;
    local_88 = (int64_t *)0x176448;
    local_80 = (char *)0x2;
    local_78 = CONCAT71(local_78._1_7_,1);
    local_8e = local_8f;
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[10])
              (local_e0.m_resultCapture,&local_e0,&local_98,&local_e0.m_reaction);
    Catch::AssertionHandler::complete(&local_e0);
    Catch::AssertionHandler::~AssertionHandler(&local_e0);
    local_e0.m_assertionInfo.macroName.m_start = "CHECK";
    local_e0.m_assertionInfo.macroName.m_size = 5;
    local_e0.m_assertionInfo.lineInfo.file =
         "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/simple.cpp";
    local_e0.m_assertionInfo.lineInfo.line = 0x4b;
    local_e0.m_assertionInfo.capturedExpression.m_start = "recvd_sum == comp_sum";
    local_e0.m_assertionInfo.capturedExpression.m_size = 0x15;
    local_e0.m_assertionInfo.resultDisposition = ContinueOnFailure;
    local_e0.m_reaction.shouldDebugBreak = false;
    local_e0.m_reaction.shouldThrow = false;
    local_e0.m_completed = false;
    local_e0.m_resultCapture = Catch::getResultCapture();
    local_8f = recvd_sum == comp_sum;
    local_90 = 1;
    local_98 = &PTR_streamReconstructedExpression_001b98a8;
    local_80 = "==";
    local_78 = 2;
    local_88 = &recvd_sum;
    local_70 = (undefined1 *)&comp_sum;
    (*(local_e0.m_resultCapture)->_vptr_IResultCapture[10])
              (local_e0.m_resultCapture,&local_e0,&local_98,&local_e0.m_reaction);
    Catch::AssertionHandler::complete(&local_e0);
    Catch::AssertionHandler::~AssertionHandler(&local_e0);
    Catch::clara::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&buffer.super__Vector_base<long,_std::allocator<long>_>);
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    p_Var5 = p_Var3;
  }
  return (int)p_Var3;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment env(argc, argv);
  diy::mpi::communicator world;

  Catch::Session session;

  SimpleFixture::nblocks = (std::max)(world.size(), 2);
  bool help;

  std::string log_level   = "info";

  // get command line arguments
  using namespace opts;
  Options ops;
  ops >> Option('b', "blocks", SimpleFixture::nblocks, "number of blocks")
      >> Option('t', "thread", SimpleFixture::threads, "number of threads")
      >> Option('l', "log",    log_level,              "log level")
      >> Option('c', "coroutines",  SimpleFixture::coroutines, "use coroutines via foreach_exchange")
      >> Option('h', "help",   help,                   "show help");
  if (!ops.parse(argc,argv) || help)
  {
    if (world.rank() == 0)
    {
      std::cout << ops;
      return 1;
    }
  }

  diy::create_logger(log_level);

  return session.run();
}